

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::wm_data,std::allocator<xray_re::wm_data>>,write_wm_data>
          (xr_writer *this,vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_> *container)

{
  bool bVar1;
  reference wm;
  __normal_iterator<const_xray_re::wm_data_*,_std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_> *container_local;
  xr_writer *this_local;
  
  end = std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>::begin(container);
  local_30._M_current =
       (wm_data *)std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) break;
    wm = __gnu_cxx::
         __normal_iterator<const_xray_re::wm_data_*,_std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>_>
         ::operator*(&end);
    write_wm_data::operator()((write_wm_data *)((long)&this_local + 7),wm,this);
    __gnu_cxx::
    __normal_iterator<const_xray_re::wm_data_*,_std::vector<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}